

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,BinaryOperator *b)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  Value local_120;
  anon_class_8_1_54a39802 local_e0;
  Value local_d8;
  undefined1 local_98 [8];
  Value result;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> local_40;
  pool_ptr<soul::AST::Constant> lhsConst;
  Type resultType;
  BinaryOperator *b_local;
  ConstantFolder *this_local;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,b);
  bVar1 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&b->super_Expression);
  if (bVar1) {
    return &b->super_Expression;
  }
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&b->rhs);
  SanityCheckPass::throwErrorIfNotReadableValue(pEVar3);
  uVar2 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[9])();
  if ((uVar2 & 1) != 0) {
    (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
         (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
    return &b->super_Expression;
  }
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&b->lhs);
  SanityCheckPass::throwErrorIfNotReadableValue(pEVar3);
  AST::BinaryOperator::getOperandType((Type *)&lhsConst,b);
  bVar1 = Type::isValid((Type *)&lhsConst);
  if (bVar1) {
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&b->lhs);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_40);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_40);
    if (bVar1) {
      pEVar3 = pool_ref<soul::AST::Expression>::operator->(&b->rhs);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                (result.allocatedData.allocatedData.space);
      bVar1 = soul::pool_ptr::operator_cast_to_bool
                        ((pool_ptr *)result.allocatedData.allocatedData.space);
      if (bVar1) {
        pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_40);
        soul::Value::Value((Value *)local_98,&pCVar4->value);
        pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                           ((pool_ptr<soul::AST::Constant> *)
                            result.allocatedData.allocatedData.space);
        soul::Value::Value(&local_d8,&pCVar4->value);
        local_e0.b = b;
        bVar1 = BinaryOp::
                apply<soul::ResolutionPass::ConstantFolder::visit(soul::AST::BinaryOperator&)::_lambda(soul::CompileMessage)_1_>
                          ((Value *)local_98,&local_d8,b->operation,&local_e0);
        soul::Value::~Value(&local_d8);
        if (bVar1) {
          soul::Value::Value(&local_120,(Value *)local_98);
          this_local = (ConstantFolder *)
                       createConstant(this,&(b->super_Expression).super_Statement.super_ASTObject.
                                            context,&local_120);
          soul::Value::~Value(&local_120);
        }
        soul::Value::~Value((Value *)local_98);
        if (!bVar1) goto LAB_003c7df7;
      }
      else {
LAB_003c7df7:
        bVar1 = false;
      }
      pool_ptr<soul::AST::Constant>::~pool_ptr
                ((pool_ptr<soul::AST::Constant> *)result.allocatedData.allocatedData.space);
      if (bVar1 == false) goto LAB_003c7e23;
    }
    else {
LAB_003c7e23:
      bVar1 = false;
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_40);
    if (bVar1 != false) goto LAB_003c7e61;
  }
  this_local = (ConstantFolder *)b;
LAB_003c7e61:
  Type::~Type((Type *)&lhsConst);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            if (failIfNotResolved (b))
                return b;

            SanityCheckPass::throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
            {
                ++numFails;
                return b;
            }

            SanityCheckPass::throwErrorIfNotReadableValue (b.lhs);
            auto resultType = b.getOperandType();

            if (resultType.isValid())
            {
                if (auto lhsConst = b.lhs->getAsConstant())
                {
                    if (auto rhsConst = b.rhs->getAsConstant())
                    {
                        auto result = lhsConst->value;

                        if (BinaryOp::apply (result, rhsConst->value, b.operation,
                                             [&] (CompileMessage message) { b.context.throwError (message); }))
                            return createConstant (b.context, std::move (result));
                    }
                }
            }

            return b;
        }